

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O2

S2ClippedShape * __thiscall S2ShapeIndexCell::find_clipped(S2ShapeIndexCell *this,int shape_id)

{
  value_type *s;
  S2ClippedShape *pSVar1;
  ulong uVar2;
  
  if ((this->shapes_).super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>.
      is_inlined_ == false) {
    pSVar1 = (this->shapes_).
             super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>.field_7.
             pointer_;
  }
  else {
    pSVar1 = (S2ClippedShape *)
             &(this->shapes_).
              super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>.field_7;
  }
  uVar2 = (ulong)((*(uint *)&(this->shapes_).
                             super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                  & 0xffffff) << 4);
  while( true ) {
    if (uVar2 == 0) {
      return (S2ClippedShape *)0x0;
    }
    if (pSVar1->shape_id_ == shape_id) break;
    pSVar1 = pSVar1 + 1;
    uVar2 = uVar2 - 0x10;
  }
  return pSVar1;
}

Assistant:

T* Array() { return IsInlined() ? InlinedSpace() : pointer_; }